

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::AddMessage
          (ExtensionSet *this,FieldDescriptor *descriptor,MessageFactory *factory)

{
  int iVar1;
  Descriptor *pDVar2;
  undefined4 extraout_var;
  LogMessage *in_RDX;
  undefined8 *in_RDI;
  MessageLite *prototype;
  MessageLite *result;
  Extension *extension;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  LogMessage *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  LogLevel_conflict level;
  LogMessage local_68;
  MessageLite *local_30;
  Type *local_28;
  Extension *local_20;
  LogMessage *local_18;
  
  level = (LogLevel_conflict)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  local_18 = in_RDX;
  local_20 = MaybeNewRepeatedExtension((ExtensionSet *)extension,(FieldDescriptor *)result);
  local_28 = RepeatedPtrFieldBase::
             AddFromCleared<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                       ((RepeatedPtrFieldBase *)
                        CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  if (local_28 == (Type *)0x0) {
    iVar1 = RepeatedPtrField<google::protobuf::MessageLite>::size
                      ((RepeatedPtrField<google::protobuf::MessageLite> *)0x55c488);
    if (iVar1 == 0) {
      pDVar2 = FieldDescriptor::message_type((FieldDescriptor *)in_stack_ffffffffffffff60);
      local_30 = (MessageLite *)(**(code **)(*(long *)local_18 + 0x10))(local_18,pDVar2);
      if (local_30 == (MessageLite *)0x0) {
        in_stack_ffffffffffffff60 = &local_68;
        LogMessage::LogMessage
                  (local_18,level,(char *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
        LogMessage::operator<<
                  (in_stack_ffffffffffffff60,
                   (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        LogFinisher::operator=
                  ((LogFinisher *)in_stack_ffffffffffffff60,
                   (LogMessage *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        LogMessage::~LogMessage((LogMessage *)0x55c533);
      }
    }
    else {
      local_30 = RepeatedPtrField<google::protobuf::MessageLite>::Get
                           ((RepeatedPtrField<google::protobuf::MessageLite> *)
                            in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    }
    iVar1 = (*local_30->_vptr_MessageLite[4])(local_30,*in_RDI);
    local_28 = (Type *)CONCAT44(extraout_var,iVar1);
    RepeatedPtrField<google::protobuf::MessageLite>::AddAllocated
              ((RepeatedPtrField<google::protobuf::MessageLite> *)in_stack_ffffffffffffff60,
               (MessageLite *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  }
  return local_28;
}

Assistant:

MessageLite* ExtensionSet::AddMessage(const FieldDescriptor* descriptor,
                                      MessageFactory* factory) {
  Extension* extension = MaybeNewRepeatedExtension(descriptor);

  // RepeatedPtrField<Message> does not know how to Add() since it cannot
  // allocate an abstract object, so we have to be tricky.
  MessageLite* result =
      reinterpret_cast<internal::RepeatedPtrFieldBase*>(
          extension->repeated_message_value)
          ->AddFromCleared<GenericTypeHandler<MessageLite> >();
  if (result == NULL) {
    const MessageLite* prototype;
    if (extension->repeated_message_value->size() == 0) {
      prototype = factory->GetPrototype(descriptor->message_type());
      GOOGLE_CHECK(prototype != NULL);
    } else {
      prototype = &extension->repeated_message_value->Get(0);
    }
    result = prototype->New(arena_);
    extension->repeated_message_value->AddAllocated(result);
  }
  return result;
}